

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# probe_method.cpp
# Opt level: O0

int __thiscall RNG::generate(RNG *this,int from,int to)

{
  result_type rVar1;
  uniform_int_distribution<int> local_40;
  uniform_int_distribution<int> dist;
  Probe probe;
  int to_local;
  int from_local;
  RNG *this_local;
  
  bm::GenericBench<std::chrono::_V2::steady_clock>::Probe::Probe
            ((Probe *)&dist,&this->_generate_mark);
  std::uniform_int_distribution<int>::uniform_int_distribution(&local_40,from,to);
  rVar1 = std::uniform_int_distribution<int>::operator()(&local_40,&this->_rd);
  bm::GenericBench<std::chrono::_V2::steady_clock>::Probe::~Probe((Probe *)&dist);
  return rVar1;
}

Assistant:

int generate(int from, int to)
    {
        Bench::Probe probe(_generate_mark);

		std::uniform_int_distribution<int> dist(from, to);
        return dist(_rd);
    }